

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner.h
# Opt level: O0

string * __thiscall
trun::DirScanner::GetExtension(string *__return_storage_ptr__,DirScanner *this,string *pathName)

{
  reference pvVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __const_iterator local_48;
  size_type local_30;
  size_type l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *pathName_local;
  DirScanner *this_local;
  string *ext;
  
  l._7_1_ = 0;
  local_20 = pathName;
  pathName_local = (string *)this;
  this_local = (DirScanner *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                       (local_20);
  while( true ) {
    local_30 = local_30 - 1;
    bVar2 = false;
    if (local_30 != 0) {
      pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](local_20,local_30);
      bVar2 = *pvVar1 != '.';
    }
    if (!bVar2) break;
    local_50._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
    pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](local_20,local_30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,local_48,*pvVar1);
  }
  if ((local_30 != 0) &&
     (pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](local_20,local_30), *pvVar1 == '.')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,0,".");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtension(std::string &pathName) {
            std::string ext;
            auto l = pathName.length() - 1;
            while ((l > 0) && (pathName[l] != '.')) {
                ext.insert(ext.begin(), pathName[l]);
                l--;
            }
            if ((l > 0) && (pathName[l] == '.')) {
                ext.insert(0, ".");
            }
            return ext;
        }